

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O1

Result __thiscall
wabt::WastParser::ParsePlainInstr
          (WastParser *this,unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *out_expr)

{
  Location loc_00;
  Location loc_01;
  Location loc_02;
  Location loc_03;
  Location loc_04;
  Location loc_05;
  Location loc_06;
  Location loc_07;
  Location loc_08;
  Location loc_09;
  Location loc_10;
  Location loc_11;
  Location loc_12;
  Location loc_13;
  Location loc_14;
  Location loc_15;
  Location loc_16;
  Location loc_17;
  Location loc_18;
  Location loc_19;
  Location loc_20;
  Location loc_21;
  Location loc_22;
  Location loc_23;
  Location loc_24;
  Location loc_25;
  Location loc_26;
  Location loc_27;
  Location loc_28;
  Token token_00;
  Token token_01;
  Token token_02;
  Token token_03;
  Token token_04;
  Token token_05;
  Token token_06;
  Token token_07;
  iterator __position;
  undefined8 uVar1;
  undefined4 uVar2;
  bool bVar3;
  TokenType TVar4;
  Result RVar5;
  TableCopyExpr *this_00;
  CallIndirectExpr *this_01;
  Expr *pEVar6;
  TableInitExpr *this_02;
  Expr *pEVar7;
  undefined **ppuVar8;
  Enum EVar9;
  undefined8 *puVar10;
  char *pcVar11;
  ExprType *this_03;
  undefined8 in_R8;
  undefined8 in_R9;
  Type *pTVar12;
  long lVar13;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *expected;
  byte bVar14;
  Location loc;
  Token token;
  uint64_t lane_idx;
  uint8_t values [16];
  Location loc_1;
  Location local_378;
  undefined1 local_358 [32];
  Type local_338;
  Type TStack_334;
  anon_union_32_2_9f84448a_for_Var_2 aStack_330;
  undefined1 local_310 [32];
  Type local_2f0 [2];
  anon_union_32_2_9f84448a_for_Var_2 local_2e8;
  _func_int **local_2c8;
  Expr *local_2c0;
  Expr *local_2b8;
  undefined4 uStack_2b0;
  undefined4 uStack_2ac;
  int local_2a8;
  int iStack_2a4;
  int iStack_2a0;
  undefined4 uStack_29c;
  Expr *local_298;
  size_type sStack_290;
  anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2 local_288;
  undefined8 uStack_280;
  Expr *local_278;
  size_type sStack_270;
  anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2 local_268;
  undefined8 uStack_260;
  vector<wabt::Type,_std::allocator<wabt::Type>_> local_250;
  undefined8 local_238;
  undefined8 uStack_230;
  undefined8 local_228;
  Token local_218;
  Token local_1d8;
  Var local_198;
  Var local_150;
  Var local_108;
  Var local_c0;
  Var local_78;
  
  bVar14 = 0;
  GetToken((Token *)local_358,this);
  local_378.filename.size_ = CONCAT44(local_358._12_4_,local_358._8_4_);
  local_378.field_1.field_0.first_column = local_358._20_4_;
  local_378.field_1.field_0.line = local_358._16_4_;
  local_378.field_1._8_8_ = CONCAT44(local_358._28_4_,local_358._24_4_);
  local_378.filename.data_ = (char *)local_358._0_8_;
  TVar4 = Peek(this,0);
  switch(TVar4) {
  case AtomicLoad:
    Consume((Token *)local_358,this);
    ErrorUnlessOpcodeEnabled(this,(Token *)local_358);
    token_00.loc.filename.size_._4_4_ = local_358._12_4_;
    token_00.loc.filename.size_._0_4_ = local_358._8_4_;
    token_00.loc.field_1.field_0.first_column = local_358._20_4_;
    token_00.loc.field_1.field_0.line = local_358._16_4_;
    token_00.loc.field_1._12_4_ = local_358._28_4_;
    token_00.loc.field_1.field_0.last_column = local_358._24_4_;
    token_00._36_4_ = TStack_334.enum_;
    token_00.token_type_ = local_338.enum_;
    token_00.field_2._4_4_ = aStack_330._4_4_;
    token_00.field_2.literal_.type = aStack_330.index_;
    token_00.field_2.literal_.text.size_._4_4_ = aStack_330._20_4_;
    token_00.field_2.literal_.text.size_._0_4_ = aStack_330._16_4_;
    loc_00.filename.size_._0_4_ = (int)local_378.filename.size_;
    loc_00.filename.data_ = local_378.filename.data_;
    loc_00.filename.size_._4_4_ = (int)(local_378.filename.size_ >> 0x20);
    loc_00.field_1.field_0.line = local_378.field_1._0_4_;
    loc_00.field_1.field_0.first_column = local_378.field_1._4_4_;
    loc_00.field_1.field_0.last_column = (int)local_378.field_1._8_8_;
    loc_00.field_1._12_4_ = (int)((ulong)local_378.field_1._8_8_ >> 0x20);
    token_00.loc.filename.data_ = (char *)local_358._0_8_;
    token_00.field_2.text_.size_ = aStack_330.name_._M_string_length;
    RVar5 = ParsePlainLoadStoreInstr<wabt::LoadStoreExpr<(wabt::ExprType)0>>
                      (this,loc_00,token_00,out_expr);
    break;
  case AtomicNotify:
    Consume((Token *)local_358,this);
    ErrorUnlessOpcodeEnabled(this,(Token *)local_358);
    token_04.loc.filename.size_._4_4_ = local_358._12_4_;
    token_04.loc.filename.size_._0_4_ = local_358._8_4_;
    token_04.loc.field_1.field_0.first_column = local_358._20_4_;
    token_04.loc.field_1.field_0.line = local_358._16_4_;
    token_04.loc.field_1._12_4_ = local_358._28_4_;
    token_04.loc.field_1.field_0.last_column = local_358._24_4_;
    token_04._36_4_ = TStack_334.enum_;
    token_04.token_type_ = local_338.enum_;
    token_04.field_2._4_4_ = aStack_330._4_4_;
    token_04.field_2.literal_.type = aStack_330.index_;
    token_04.field_2.literal_.text.size_._4_4_ = aStack_330._20_4_;
    token_04.field_2.literal_.text.size_._0_4_ = aStack_330._16_4_;
    loc_12.filename.size_._0_4_ = (int)local_378.filename.size_;
    loc_12.filename.data_ = local_378.filename.data_;
    loc_12.filename.size_._4_4_ = (int)(local_378.filename.size_ >> 0x20);
    loc_12.field_1.field_0.line = local_378.field_1._0_4_;
    loc_12.field_1.field_0.first_column = local_378.field_1._4_4_;
    loc_12.field_1.field_0.last_column = (int)local_378.field_1._8_8_;
    loc_12.field_1._12_4_ = (int)((ulong)local_378.field_1._8_8_ >> 0x20);
    token_04.loc.filename.data_ = (char *)local_358._0_8_;
    token_04.field_2.text_.size_ = aStack_330.name_._M_string_length;
    RVar5 = ParsePlainLoadStoreInstr<wabt::LoadStoreExpr<(wabt::ExprType)4>>
                      (this,loc_12,token_04,out_expr);
    break;
  case AtomicRmw:
    Consume((Token *)local_358,this);
    ErrorUnlessOpcodeEnabled(this,(Token *)local_358);
    token_01.loc.filename.size_._4_4_ = local_358._12_4_;
    token_01.loc.filename.size_._0_4_ = local_358._8_4_;
    token_01.loc.field_1.field_0.first_column = local_358._20_4_;
    token_01.loc.field_1.field_0.line = local_358._16_4_;
    token_01.loc.field_1._12_4_ = local_358._28_4_;
    token_01.loc.field_1.field_0.last_column = local_358._24_4_;
    token_01._36_4_ = TStack_334.enum_;
    token_01.token_type_ = local_338.enum_;
    token_01.field_2._4_4_ = aStack_330._4_4_;
    token_01.field_2.literal_.type = aStack_330.index_;
    token_01.field_2.literal_.text.size_._4_4_ = aStack_330._20_4_;
    token_01.field_2.literal_.text.size_._0_4_ = aStack_330._16_4_;
    loc_08.filename.size_._0_4_ = (int)local_378.filename.size_;
    loc_08.filename.data_ = local_378.filename.data_;
    loc_08.filename.size_._4_4_ = (int)(local_378.filename.size_ >> 0x20);
    loc_08.field_1.field_0.line = local_378.field_1._0_4_;
    loc_08.field_1.field_0.first_column = local_378.field_1._4_4_;
    loc_08.field_1.field_0.last_column = (int)local_378.field_1._8_8_;
    loc_08.field_1._12_4_ = (int)((ulong)local_378.field_1._8_8_ >> 0x20);
    token_01.loc.filename.data_ = (char *)local_358._0_8_;
    token_01.field_2.text_.size_ = aStack_330.name_._M_string_length;
    RVar5 = ParsePlainLoadStoreInstr<wabt::LoadStoreExpr<(wabt::ExprType)1>>
                      (this,loc_08,token_01,out_expr);
    break;
  case AtomicRmwCmpxchg:
    Consume((Token *)local_358,this);
    ErrorUnlessOpcodeEnabled(this,(Token *)local_358);
    token_03.loc.filename.size_._4_4_ = local_358._12_4_;
    token_03.loc.filename.size_._0_4_ = local_358._8_4_;
    token_03.loc.field_1.field_0.first_column = local_358._20_4_;
    token_03.loc.field_1.field_0.line = local_358._16_4_;
    token_03.loc.field_1._12_4_ = local_358._28_4_;
    token_03.loc.field_1.field_0.last_column = local_358._24_4_;
    token_03._36_4_ = TStack_334.enum_;
    token_03.token_type_ = local_338.enum_;
    token_03.field_2._4_4_ = aStack_330._4_4_;
    token_03.field_2.literal_.type = aStack_330.index_;
    token_03.field_2.literal_.text.size_._4_4_ = aStack_330._20_4_;
    token_03.field_2.literal_.text.size_._0_4_ = aStack_330._16_4_;
    loc_10.filename.size_._0_4_ = (int)local_378.filename.size_;
    loc_10.filename.data_ = local_378.filename.data_;
    loc_10.filename.size_._4_4_ = (int)(local_378.filename.size_ >> 0x20);
    loc_10.field_1.field_0.line = local_378.field_1._0_4_;
    loc_10.field_1.field_0.first_column = local_378.field_1._4_4_;
    loc_10.field_1.field_0.last_column = (int)local_378.field_1._8_8_;
    loc_10.field_1._12_4_ = (int)((ulong)local_378.field_1._8_8_ >> 0x20);
    token_03.loc.filename.data_ = (char *)local_358._0_8_;
    token_03.field_2.text_.size_ = aStack_330.name_._M_string_length;
    RVar5 = ParsePlainLoadStoreInstr<wabt::LoadStoreExpr<(wabt::ExprType)2>>
                      (this,loc_10,token_03,out_expr);
    break;
  case AtomicStore:
    Consume((Token *)local_358,this);
    ErrorUnlessOpcodeEnabled(this,(Token *)local_358);
    token_05.loc.filename.size_._4_4_ = local_358._12_4_;
    token_05.loc.filename.size_._0_4_ = local_358._8_4_;
    token_05.loc.field_1.field_0.first_column = local_358._20_4_;
    token_05.loc.field_1.field_0.line = local_358._16_4_;
    token_05.loc.field_1._12_4_ = local_358._28_4_;
    token_05.loc.field_1.field_0.last_column = local_358._24_4_;
    token_05._36_4_ = TStack_334.enum_;
    token_05.token_type_ = local_338.enum_;
    token_05.field_2._4_4_ = aStack_330._4_4_;
    token_05.field_2.literal_.type = aStack_330.index_;
    token_05.field_2.literal_.text.size_._4_4_ = aStack_330._20_4_;
    token_05.field_2.literal_.text.size_._0_4_ = aStack_330._16_4_;
    loc_15.filename.size_._0_4_ = (int)local_378.filename.size_;
    loc_15.filename.data_ = local_378.filename.data_;
    loc_15.filename.size_._4_4_ = (int)(local_378.filename.size_ >> 0x20);
    loc_15.field_1.field_0.line = local_378.field_1._0_4_;
    loc_15.field_1.field_0.first_column = local_378.field_1._4_4_;
    loc_15.field_1.field_0.last_column = (int)local_378.field_1._8_8_;
    loc_15.field_1._12_4_ = (int)((ulong)local_378.field_1._8_8_ >> 0x20);
    token_05.loc.filename.data_ = (char *)local_358._0_8_;
    token_05.field_2.text_.size_ = aStack_330.name_._M_string_length;
    RVar5 = ParsePlainLoadStoreInstr<wabt::LoadStoreExpr<(wabt::ExprType)3>>
                      (this,loc_15,token_05,out_expr);
    break;
  case AtomicWait:
    Consume((Token *)local_358,this);
    ErrorUnlessOpcodeEnabled(this,(Token *)local_358);
    token_06.loc.filename.size_._4_4_ = local_358._12_4_;
    token_06.loc.filename.size_._0_4_ = local_358._8_4_;
    token_06.loc.field_1.field_0.first_column = local_358._20_4_;
    token_06.loc.field_1.field_0.line = local_358._16_4_;
    token_06.loc.field_1._12_4_ = local_358._28_4_;
    token_06.loc.field_1.field_0.last_column = local_358._24_4_;
    token_06._36_4_ = TStack_334.enum_;
    token_06.token_type_ = local_338.enum_;
    token_06.field_2._4_4_ = aStack_330._4_4_;
    token_06.field_2.type_.enum_ = (Type)(Type)aStack_330.index_;
    token_06.field_2.literal_.text.size_._4_4_ = aStack_330._20_4_;
    token_06.field_2.literal_.text.size_._0_4_ = aStack_330._16_4_;
    loc_17.filename.size_._0_4_ = (int)local_378.filename.size_;
    loc_17.filename.data_ = local_378.filename.data_;
    loc_17.filename.size_._4_4_ = (int)(local_378.filename.size_ >> 0x20);
    loc_17.field_1.field_0.line = local_378.field_1._0_4_;
    loc_17.field_1.field_0.first_column = local_378.field_1._4_4_;
    loc_17.field_1.field_0.last_column = (int)local_378.field_1._8_8_;
    loc_17.field_1._12_4_ = (int)((ulong)local_378.field_1._8_8_ >> 0x20);
    token_06.loc.filename.data_ = (char *)local_358._0_8_;
    token_06.field_2.text_.size_ = aStack_330.name_._M_string_length;
    RVar5 = ParsePlainLoadStoreInstr<wabt::LoadStoreExpr<(wabt::ExprType)5>>
                      (this,loc_17,token_06,out_expr);
    break;
  case Binary:
    Consume((Token *)local_358,this);
    ErrorUnlessOpcodeEnabled(this,(Token *)local_358);
    pEVar6 = (Expr *)operator_new(0x40);
    if (0x3d < local_338.enum_ - 0x32) {
LAB_0016980f:
      __assert_fail("HasOpcode()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/token.h"
                    ,0x65,"Opcode wabt::Token::opcode() const");
    }
    (pEVar6->super_intrusive_list_base<wabt::Expr>).next_ = (Expr *)0x0;
    (pEVar6->super_intrusive_list_base<wabt::Expr>).prev_ = (Expr *)0x0;
    pEVar6->_vptr_Expr = (_func_int **)&PTR__Expr_001c0810;
    (pEVar6->loc).filename.data_ = local_378.filename.data_;
    (pEVar6->loc).filename.size_ = local_378.filename.size_;
    (pEVar6->loc).field_1.field_1.offset = (size_t)local_378.field_1.field_1.offset;
    *(undefined8 *)((long)&(pEVar6->loc).field_1 + 8) = local_378.field_1._8_8_;
    pEVar6->type_ = Binary;
    ppuVar8 = &PTR__Expr_001c15c0;
    goto LAB_00168f4a;
  default:
    __assert_fail("!\"ParsePlainInstr should only be called when IsPlainInstr() is true\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/wast-parser.cc"
                  ,0x837,"Result wabt::WastParser::ParsePlainInstr(std::unique_ptr<Expr> *)");
  case Br:
    Consume((Token *)local_358,this);
    loc_16.filename.size_._0_4_ = (int)local_378.filename.size_;
    loc_16.filename.data_ = local_378.filename.data_;
    loc_16.filename.size_._4_4_ = (int)(local_378.filename.size_ >> 0x20);
    loc_16.field_1.field_0.line = local_378.field_1._0_4_;
    loc_16.field_1.field_0.first_column = local_378.field_1._4_4_;
    loc_16.field_1.field_0.last_column = (int)local_378.field_1._8_8_;
    loc_16.field_1._12_4_ = (int)((ulong)local_378.field_1._8_8_ >> 0x20);
    RVar5 = ParsePlainInstrVar<wabt::VarExpr<(wabt::ExprType)8>>(this,loc_16,out_expr);
    break;
  case BrIf:
    Consume((Token *)local_358,this);
    loc_07.filename.size_._0_4_ = (int)local_378.filename.size_;
    loc_07.filename.data_ = local_378.filename.data_;
    loc_07.filename.size_._4_4_ = (int)(local_378.filename.size_ >> 0x20);
    loc_07.field_1.field_0.line = local_378.field_1._0_4_;
    loc_07.field_1.field_0.first_column = local_378.field_1._4_4_;
    loc_07.field_1.field_0.last_column = (int)local_378.field_1._8_8_;
    loc_07.field_1._12_4_ = (int)((ulong)local_378.field_1._8_8_ >> 0x20);
    RVar5 = ParsePlainInstrVar<wabt::VarExpr<(wabt::ExprType)9>>(this,loc_07,out_expr);
    break;
  case BrOnExn:
    Consume((Token *)local_358,this);
    this_01 = (CallIndirectExpr *)operator_new(0xd0);
    BrOnExnExpr::BrOnExnExpr((BrOnExnExpr *)this_01,&local_378);
    RVar5 = ParseVar(this,(Var *)&this_01->decl);
    if (RVar5.enum_ == Error) goto LAB_00168678;
    RVar5 = ParseVar(this,(Var *)((long)&(this_01->decl).type_var.field_2 + 0x18));
    goto LAB_0016866f;
  case BrTable:
    Consume((Token *)local_358,this);
    MakeUnique<wabt::BrTableExpr,wabt::Location&>((wabt *)local_358,&local_378);
    RVar5 = ParseVarList(this,(VarVector *)(local_358._0_8_ + 0x40));
    pEVar6 = (Expr *)local_358._0_8_;
    if (RVar5.enum_ != Error) {
      Var::operator=((Var *)&((Expr *)(local_358._0_8_ + 0x40))->loc,
                     (Var *)&(((Expr *)(local_358._0_8_ + 0x40))->
                             super_intrusive_list_base<wabt::Expr>).next_[-2].type_);
      this_03 = &(((Expr *)(local_358._0_8_ + 0x40))->super_intrusive_list_base<wabt::Expr>).next_
                 [-2].type_;
      (((Expr *)(local_358._0_8_ + 0x40))->super_intrusive_list_base<wabt::Expr>).next_ =
           (Expr *)this_03;
      Var::~Var((Var *)this_03);
      uVar1 = local_358._0_8_;
      local_358._0_8_ = (Expr *)0x0;
      pEVar7 = (out_expr->_M_t).super___uniq_ptr_impl<wabt::Expr,_std::default_delete<wabt::Expr>_>.
               _M_t.super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
               super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl;
      (out_expr->_M_t).super___uniq_ptr_impl<wabt::Expr,_std::default_delete<wabt::Expr>_>._M_t.
      super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
      super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl = (Expr *)uVar1;
      pEVar6 = (Expr *)local_358._0_8_;
      if (pEVar7 != (Expr *)0x0) {
        (*pEVar7->_vptr_Expr[1])();
        pEVar6 = (Expr *)local_358._0_8_;
      }
    }
    goto LAB_00168ad9;
  case Call:
    Consume((Token *)local_358,this);
    loc_04.filename.size_._0_4_ = (int)local_378.filename.size_;
    loc_04.filename.data_ = local_378.filename.data_;
    loc_04.filename.size_._4_4_ = (int)(local_378.filename.size_ >> 0x20);
    loc_04.field_1.field_0.line = local_378.field_1._0_4_;
    loc_04.field_1.field_0.first_column = local_378.field_1._4_4_;
    loc_04.field_1.field_0.last_column = (int)local_378.field_1._8_8_;
    loc_04.field_1._12_4_ = (int)((ulong)local_378.field_1._8_8_ >> 0x20);
    RVar5 = ParsePlainInstrVar<wabt::VarExpr<(wabt::ExprType)12>>(this,loc_04,out_expr);
    break;
  case CallIndirect:
    Consume((Token *)local_358,this);
    this_01 = (CallIndirectExpr *)operator_new(0x108);
    CallIndirectExpr::CallIndirectExpr(this_01,&local_378);
    Var::Var(&local_78,0,&local_378);
    ParseVarOpt(this,&this_01->table,&local_78);
    Var::~Var(&local_78);
    RVar5 = ParseTypeUseOpt(this,&this_01->decl);
    if (RVar5.enum_ == Error) goto LAB_00168678;
    RVar5 = ParseUnboundFuncSignature(this,&(this_01->decl).sig);
LAB_0016866f:
    if (RVar5.enum_ == Error) {
LAB_00168678:
      (*(((ExprMixin<(wabt::ExprType)39> *)&this_01->super_ExprMixin<(wabt::ExprType)13>)->
        super_Expr)._vptr_Expr[1])(this_01);
      return (Result)Error;
    }
    goto LAB_001688af;
  case Compare:
    this_01 = (CallIndirectExpr *)operator_new(0x40);
    Consume((Token *)local_358,this);
    if (0x3d < local_338.enum_ - 0x32) goto LAB_0016980f;
    (((ExprMixin<(wabt::ExprType)39> *)&this_01->super_ExprMixin<(wabt::ExprType)13>)->super_Expr).
    super_intrusive_list_base<wabt::Expr>.next_ = (Expr *)0x0;
    (((ExprMixin<(wabt::ExprType)39> *)&this_01->super_ExprMixin<(wabt::ExprType)13>)->super_Expr).
    super_intrusive_list_base<wabt::Expr>.prev_ = (Expr *)0x0;
    (((ExprMixin<(wabt::ExprType)39> *)&this_01->super_ExprMixin<(wabt::ExprType)13>)->super_Expr).
    _vptr_Expr = (_func_int **)&PTR__Expr_001c0810;
    (((ExprMixin<(wabt::ExprType)39> *)&this_01->super_ExprMixin<(wabt::ExprType)13>)->super_Expr).
    loc.filename.data_ = local_378.filename.data_;
    (((ExprMixin<(wabt::ExprType)39> *)&this_01->super_ExprMixin<(wabt::ExprType)13>)->super_Expr).
    loc.filename.size_ = local_378.filename.size_;
    (((ExprMixin<(wabt::ExprType)39> *)&this_01->super_ExprMixin<(wabt::ExprType)13>)->super_Expr).
    loc.field_1.field_1.offset = (size_t)local_378.field_1.field_1.offset;
    *(undefined8 *)
     ((long)&(((ExprMixin<(wabt::ExprType)39> *)&this_01->super_ExprMixin<(wabt::ExprType)13>)->
             super_Expr).loc.field_1 + 8) = local_378.field_1._8_8_;
    (((ExprMixin<(wabt::ExprType)39> *)&this_01->super_ExprMixin<(wabt::ExprType)13>)->super_Expr).
    type_ = Compare;
    (((ExprMixin<(wabt::ExprType)39> *)&this_01->super_ExprMixin<(wabt::ExprType)13>)->super_Expr).
    _vptr_Expr = (_func_int **)&PTR__Expr_001c1610;
    *(Index *)&(((ExprMixin<(wabt::ExprType)39> *)&this_01->super_ExprMixin<(wabt::ExprType)13>)->
               super_Expr).field_0x3c = aStack_330.index_;
    goto LAB_001688af;
  case Const:
    local_358._16_4_ = 0;
    local_358._20_4_ = 0;
    local_358._24_4_ = 0;
    local_358._0_8_ = (Expr *)0x0;
    local_358._8_4_ = 0;
    local_358._12_4_ = 0;
    local_338.enum_ = ~Index;
    aStack_330.index_ = Int;
    aStack_330._16_4_ = 0;
    RVar5 = ParseConst(this,(Const *)local_358,Normal);
    if (RVar5.enum_ == Error) {
      return (Result)Error;
    }
    pEVar7 = (Expr *)operator_new(0x88);
    (pEVar7->super_intrusive_list_base<wabt::Expr>).next_ = (Expr *)0x0;
    (pEVar7->super_intrusive_list_base<wabt::Expr>).prev_ = (Expr *)0x0;
    pEVar7->_vptr_Expr = (_func_int **)&PTR__Expr_001c0810;
    *(undefined4 *)&(pEVar7->loc).filename.data_ = local_378.filename.data_._0_4_;
    *(undefined4 *)((long)&(pEVar7->loc).filename.data_ + 4) = local_378.filename.data_._4_4_;
    *(undefined4 *)&(pEVar7->loc).filename.size_ = (undefined4)local_378.filename.size_;
    *(undefined4 *)((long)&(pEVar7->loc).filename.size_ + 4) = local_378.filename.size_._4_4_;
    (pEVar7->loc).field_1.field_1.offset = (size_t)local_378.field_1.field_1.offset;
    *(undefined8 *)((long)&(pEVar7->loc).field_1 + 8) = local_378.field_1._8_8_;
    pEVar7->type_ = Const;
    pEVar7->_vptr_Expr = (_func_int **)&PTR__Expr_001c0830;
    puVar10 = (undefined8 *)local_358;
    pEVar6 = pEVar7 + 1;
    for (lVar13 = 9; lVar13 != 0; lVar13 = lVar13 + -1) {
      pEVar6->_vptr_Expr = (_func_int **)*puVar10;
      puVar10 = puVar10 + (ulong)bVar14 * -2 + 1;
      pEVar6 = (Expr *)((long)pEVar6 + ((ulong)bVar14 * -2 + 1) * 8);
    }
    pEVar6 = (out_expr->_M_t).super___uniq_ptr_impl<wabt::Expr,_std::default_delete<wabt::Expr>_>.
             _M_t.super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
             super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl;
    (out_expr->_M_t).super___uniq_ptr_impl<wabt::Expr,_std::default_delete<wabt::Expr>_>._M_t.
    super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
    super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl = pEVar7;
LAB_00168ad9:
    if (pEVar6 != (Expr *)0x0) {
      (*pEVar6->_vptr_Expr[1])();
    }
joined_r0x00169559:
    if (RVar5.enum_ == Error) {
      return (Result)Error;
    }
    goto LAB_0016944e;
  case Convert:
    Consume((Token *)local_358,this);
    ErrorUnlessOpcodeEnabled(this,(Token *)local_358);
    pEVar6 = (Expr *)operator_new(0x40);
    if (0x3d < local_338.enum_ - 0x32) goto LAB_0016980f;
    (pEVar6->super_intrusive_list_base<wabt::Expr>).next_ = (Expr *)0x0;
    (pEVar6->super_intrusive_list_base<wabt::Expr>).prev_ = (Expr *)0x0;
    pEVar6->_vptr_Expr = (_func_int **)&PTR__Expr_001c0810;
    (pEVar6->loc).filename.data_ = local_378.filename.data_;
    (pEVar6->loc).filename.size_ = local_378.filename.size_;
    (pEVar6->loc).field_1.field_1.offset = (size_t)local_378.field_1.field_1.offset;
    *(undefined8 *)((long)&(pEVar6->loc).field_1 + 8) = local_378.field_1._8_8_;
    pEVar6->type_ = Convert;
    ppuVar8 = &PTR__Expr_001c1660;
    goto LAB_00168f4a;
  case DataDrop:
    Consume((Token *)local_358,this);
    ErrorUnlessOpcodeEnabled(this,(Token *)local_358);
    loc_11.filename.size_._0_4_ = (int)local_378.filename.size_;
    loc_11.filename.data_ = local_378.filename.data_;
    loc_11.filename.size_._4_4_ = (int)(local_378.filename.size_ >> 0x20);
    loc_11.field_1.field_0.line = local_378.field_1._0_4_;
    loc_11.field_1.field_0.first_column = local_378.field_1._4_4_;
    loc_11.field_1.field_0.last_column = (int)local_378.field_1._8_8_;
    loc_11.field_1._12_4_ = (int)((ulong)local_378.field_1._8_8_ >> 0x20);
    RVar5 = ParsePlainInstrVar<wabt::VarExpr<(wabt::ExprType)27>>(this,loc_11,out_expr);
    break;
  case Drop:
    Consume((Token *)local_358,this);
    pEVar6 = (Expr *)operator_new(0x40);
    (pEVar6->super_intrusive_list_base<wabt::Expr>).next_ = (Expr *)0x0;
    (pEVar6->super_intrusive_list_base<wabt::Expr>).prev_ = (Expr *)0x0;
    pEVar6->_vptr_Expr = (_func_int **)&PTR__Expr_001c0810;
    (pEVar6->loc).filename.data_ = local_378.filename.data_;
    (pEVar6->loc).filename.size_ = local_378.filename.size_;
    (pEVar6->loc).field_1.field_1.offset = (size_t)local_378.field_1.field_1.offset;
    *(undefined8 *)((long)&(pEVar6->loc).field_1 + 8) = local_378.field_1._8_8_;
    pEVar6->type_ = Drop;
    ppuVar8 = &PTR__Expr_001c1050;
    goto LAB_001691d5;
  case ElemDrop:
    Consume((Token *)local_358,this);
    ErrorUnlessOpcodeEnabled(this,(Token *)local_358);
    loc_20.filename.size_._0_4_ = (int)local_378.filename.size_;
    loc_20.filename.data_ = local_378.filename.data_;
    loc_20.filename.size_._4_4_ = (int)(local_378.filename.size_ >> 0x20);
    loc_20.field_1.field_0.line = local_378.field_1._0_4_;
    loc_20.field_1.field_0.first_column = local_378.field_1._4_4_;
    loc_20.field_1.field_0.last_column = (int)local_378.field_1._8_8_;
    loc_20.field_1._12_4_ = (int)((ulong)local_378.field_1._8_8_ >> 0x20);
    RVar5 = ParsePlainInstrVar<wabt::VarExpr<(wabt::ExprType)46>>(this,loc_20,out_expr);
    break;
  case GlobalGet:
    Consume((Token *)local_358,this);
    loc_06.filename.size_._0_4_ = (int)local_378.filename.size_;
    loc_06.filename.data_ = local_378.filename.data_;
    loc_06.filename.size_._4_4_ = (int)(local_378.filename.size_ >> 0x20);
    loc_06.field_1.field_0.line = local_378.field_1._0_4_;
    loc_06.field_1.field_0.first_column = local_378.field_1._4_4_;
    loc_06.field_1.field_0.last_column = (int)local_378.field_1._8_8_;
    loc_06.field_1._12_4_ = (int)((ulong)local_378.field_1._8_8_ >> 0x20);
    RVar5 = ParsePlainInstrVar<wabt::VarExpr<(wabt::ExprType)18>>(this,loc_06,out_expr);
    break;
  case GlobalSet:
    Consume((Token *)local_358,this);
    loc_05.filename.size_._0_4_ = (int)local_378.filename.size_;
    loc_05.filename.data_ = local_378.filename.data_;
    loc_05.filename.size_._4_4_ = (int)(local_378.filename.size_ >> 0x20);
    loc_05.field_1.field_0.line = local_378.field_1._0_4_;
    loc_05.field_1.field_0.first_column = local_378.field_1._4_4_;
    loc_05.field_1.field_0.last_column = (int)local_378.field_1._8_8_;
    loc_05.field_1._12_4_ = (int)((ulong)local_378.field_1._8_8_ >> 0x20);
    RVar5 = ParsePlainInstrVar<wabt::VarExpr<(wabt::ExprType)19>>(this,loc_05,out_expr);
    break;
  case Load:
    local_268.offset = (size_t)local_378.field_1.field_1.offset;
    uStack_260 = local_378.field_1._8_8_;
    local_278 = (Expr *)local_378.filename.data_;
    sStack_270 = local_378.filename.size_;
    Consume(&local_1d8,this);
    loc_09.filename.size_._0_4_ = (int)sStack_270;
    loc_09.filename.data_ = (char *)local_278;
    loc_09.filename.size_._4_4_ = (int)(sStack_270 >> 0x20);
    loc_09.field_1.field_0.line = (int)local_268.offset;
    loc_09.field_1.field_0.first_column = (int)(local_268.offset >> 0x20);
    loc_09.field_1.field_0.last_column = (int)uStack_260;
    loc_09.field_1._12_4_ = (int)((ulong)uStack_260 >> 0x20);
    token_02.loc.filename.size_ = local_1d8.loc.filename.size_;
    token_02.loc.filename.data_ = local_1d8.loc.filename.data_;
    token_02.loc.field_1.field_1.offset = local_1d8.loc.field_1.field_1.offset;
    token_02.loc.field_1._8_8_ = local_1d8.loc.field_1._8_8_;
    token_02.token_type_ = local_1d8.token_type_;
    token_02._36_4_ = local_1d8._36_4_;
    token_02.field_2.text_.data_ = local_1d8.field_2.text_.data_;
    token_02.field_2.text_.size_ = local_1d8.field_2.text_.size_;
    token_02.field_2.literal_.text.size_ = local_1d8.field_2.literal_.text.size_;
    RVar5 = ParsePlainLoadStoreInstr<wabt::LoadStoreExpr<(wabt::ExprType)21>>
                      (this,loc_09,token_02,out_expr);
    break;
  case LocalGet:
    Consume((Token *)local_358,this);
    loc_22.filename.size_._0_4_ = (int)local_378.filename.size_;
    loc_22.filename.data_ = local_378.filename.data_;
    loc_22.filename.size_._4_4_ = (int)(local_378.filename.size_ >> 0x20);
    loc_22.field_1.field_0.line = local_378.field_1._0_4_;
    loc_22.field_1.field_0.first_column = local_378.field_1._4_4_;
    loc_22.field_1.field_0.last_column = (int)local_378.field_1._8_8_;
    loc_22.field_1._12_4_ = (int)((ulong)local_378.field_1._8_8_ >> 0x20);
    RVar5 = ParsePlainInstrVar<wabt::VarExpr<(wabt::ExprType)22>>(this,loc_22,out_expr);
    break;
  case LocalSet:
    Consume((Token *)local_358,this);
    loc_02.filename.size_._0_4_ = (int)local_378.filename.size_;
    loc_02.filename.data_ = local_378.filename.data_;
    loc_02.filename.size_._4_4_ = (int)(local_378.filename.size_ >> 0x20);
    loc_02.field_1.field_0.line = local_378.field_1._0_4_;
    loc_02.field_1.field_0.first_column = local_378.field_1._4_4_;
    loc_02.field_1.field_0.last_column = (int)local_378.field_1._8_8_;
    loc_02.field_1._12_4_ = (int)((ulong)local_378.field_1._8_8_ >> 0x20);
    RVar5 = ParsePlainInstrVar<wabt::VarExpr<(wabt::ExprType)23>>(this,loc_02,out_expr);
    break;
  case LocalTee:
    Consume((Token *)local_358,this);
    loc_21.filename.size_._0_4_ = (int)local_378.filename.size_;
    loc_21.filename.data_ = local_378.filename.data_;
    loc_21.filename.size_._4_4_ = (int)(local_378.filename.size_ >> 0x20);
    loc_21.field_1.field_0.line = local_378.field_1._0_4_;
    loc_21.field_1.field_0.first_column = local_378.field_1._4_4_;
    loc_21.field_1.field_0.last_column = (int)local_378.field_1._8_8_;
    loc_21.field_1._12_4_ = (int)((ulong)local_378.field_1._8_8_ >> 0x20);
    RVar5 = ParsePlainInstrVar<wabt::VarExpr<(wabt::ExprType)24>>(this,loc_21,out_expr);
    break;
  case MemoryCopy:
    Consume((Token *)local_358,this);
    ErrorUnlessOpcodeEnabled(this,(Token *)local_358);
    pEVar6 = (Expr *)operator_new(0x40);
    (pEVar6->super_intrusive_list_base<wabt::Expr>).next_ = (Expr *)0x0;
    (pEVar6->super_intrusive_list_base<wabt::Expr>).prev_ = (Expr *)0x0;
    pEVar6->_vptr_Expr = (_func_int **)&PTR__Expr_001c0810;
    (pEVar6->loc).filename.data_ = local_378.filename.data_;
    (pEVar6->loc).filename.size_ = local_378.filename.size_;
    (pEVar6->loc).field_1.field_1.offset = (size_t)local_378.field_1.field_1.offset;
    *(undefined8 *)((long)&(pEVar6->loc).field_1 + 8) = local_378.field_1._8_8_;
    pEVar6->type_ = MemoryCopy;
    ppuVar8 = &PTR__Expr_001c16b0;
    goto LAB_001691d5;
  case MemoryFill:
    Consume((Token *)local_358,this);
    ErrorUnlessOpcodeEnabled(this,(Token *)local_358);
    pEVar6 = (Expr *)operator_new(0x40);
    (pEVar6->super_intrusive_list_base<wabt::Expr>).next_ = (Expr *)0x0;
    (pEVar6->super_intrusive_list_base<wabt::Expr>).prev_ = (Expr *)0x0;
    pEVar6->_vptr_Expr = (_func_int **)&PTR__Expr_001c0810;
    (pEVar6->loc).filename.data_ = local_378.filename.data_;
    (pEVar6->loc).filename.size_ = local_378.filename.size_;
    (pEVar6->loc).field_1.field_1.offset = (size_t)local_378.field_1.field_1.offset;
    *(undefined8 *)((long)&(pEVar6->loc).field_1 + 8) = local_378.field_1._8_8_;
    pEVar6->type_ = MemoryFill;
    ppuVar8 = &PTR__Expr_001c16e8;
    goto LAB_001691d5;
  case MemoryGrow:
    Consume((Token *)local_358,this);
    pEVar6 = (Expr *)operator_new(0x40);
    (pEVar6->super_intrusive_list_base<wabt::Expr>).next_ = (Expr *)0x0;
    (pEVar6->super_intrusive_list_base<wabt::Expr>).prev_ = (Expr *)0x0;
    pEVar6->_vptr_Expr = (_func_int **)&PTR__Expr_001c0810;
    (pEVar6->loc).filename.data_ = local_378.filename.data_;
    (pEVar6->loc).filename.size_ = local_378.filename.size_;
    (pEVar6->loc).field_1.field_1.offset = (size_t)local_378.field_1.field_1.offset;
    *(undefined8 *)((long)&(pEVar6->loc).field_1 + 8) = local_378.field_1._8_8_;
    pEVar6->type_ = MemoryGrow;
    ppuVar8 = &PTR__Expr_001c17f8;
    goto LAB_001691d5;
  case MemoryInit:
    Consume((Token *)local_358,this);
    ErrorUnlessOpcodeEnabled(this,(Token *)local_358);
    loc_18.filename.size_._0_4_ = (int)local_378.filename.size_;
    loc_18.filename.data_ = local_378.filename.data_;
    loc_18.filename.size_._4_4_ = (int)(local_378.filename.size_ >> 0x20);
    loc_18.field_1.field_0.line = local_378.field_1._0_4_;
    loc_18.field_1.field_0.first_column = local_378.field_1._4_4_;
    loc_18.field_1.field_0.last_column = (int)local_378.field_1._8_8_;
    loc_18.field_1._12_4_ = (int)((ulong)local_378.field_1._8_8_ >> 0x20);
    RVar5 = ParsePlainInstrVar<wabt::VarExpr<(wabt::ExprType)30>>(this,loc_18,out_expr);
    break;
  case MemorySize:
    Consume((Token *)local_358,this);
    pEVar6 = (Expr *)operator_new(0x40);
    (pEVar6->super_intrusive_list_base<wabt::Expr>).next_ = (Expr *)0x0;
    (pEVar6->super_intrusive_list_base<wabt::Expr>).prev_ = (Expr *)0x0;
    pEVar6->_vptr_Expr = (_func_int **)&PTR__Expr_001c0810;
    (pEVar6->loc).filename.data_ = local_378.filename.data_;
    (pEVar6->loc).filename.size_ = local_378.filename.size_;
    (pEVar6->loc).field_1.field_1.offset = (size_t)local_378.field_1.field_1.offset;
    *(undefined8 *)((long)&(pEVar6->loc).field_1 + 8) = local_378.field_1._8_8_;
    pEVar6->type_ = MemorySize;
    ppuVar8 = &PTR__Expr_001c17c0;
    goto LAB_001691d5;
  case Nop:
    Consume((Token *)local_358,this);
    pEVar6 = (Expr *)operator_new(0x40);
    (pEVar6->super_intrusive_list_base<wabt::Expr>).next_ = (Expr *)0x0;
    (pEVar6->super_intrusive_list_base<wabt::Expr>).prev_ = (Expr *)0x0;
    pEVar6->_vptr_Expr = (_func_int **)&PTR__Expr_001c0810;
    (pEVar6->loc).filename.data_ = local_378.filename.data_;
    (pEVar6->loc).filename.size_ = local_378.filename.size_;
    (pEVar6->loc).field_1.field_1.offset = (size_t)local_378.field_1.field_1.offset;
    *(undefined8 *)((long)&(pEVar6->loc).field_1 + 8) = local_378.field_1._8_8_;
    pEVar6->type_ = Nop;
    ppuVar8 = &PTR__Expr_001c1018;
    goto LAB_001691d5;
  case RefFunc:
    Consume((Token *)local_358,this);
    ErrorUnlessOpcodeEnabled(this,(Token *)local_358);
    loc_14.filename.size_._0_4_ = (int)local_378.filename.size_;
    loc_14.filename.data_ = local_378.filename.data_;
    loc_14.filename.size_._4_4_ = (int)(local_378.filename.size_ >> 0x20);
    loc_14.field_1.field_0.line = local_378.field_1._0_4_;
    loc_14.field_1.field_0.first_column = local_378.field_1._4_4_;
    loc_14.field_1.field_0.last_column = (int)local_378.field_1._8_8_;
    loc_14.field_1._12_4_ = (int)((ulong)local_378.field_1._8_8_ >> 0x20);
    RVar5 = ParsePlainInstrVar<wabt::VarExpr<(wabt::ExprType)34>>(this,loc_14,out_expr);
    break;
  case RefIsNull:
    Consume((Token *)local_358,this);
    ErrorUnlessOpcodeEnabled(this,(Token *)local_358);
    pEVar6 = (Expr *)operator_new(0x40);
    (pEVar6->super_intrusive_list_base<wabt::Expr>).next_ = (Expr *)0x0;
    (pEVar6->super_intrusive_list_base<wabt::Expr>).prev_ = (Expr *)0x0;
    pEVar6->_vptr_Expr = (_func_int **)&PTR__Expr_001c0810;
    (pEVar6->loc).filename.data_ = local_378.filename.data_;
    (pEVar6->loc).filename.size_ = local_378.filename.size_;
    (pEVar6->loc).field_1.field_1.offset = (size_t)local_378.field_1.field_1.offset;
    *(undefined8 *)((long)&(pEVar6->loc).field_1 + 8) = local_378.field_1._8_8_;
    pEVar6->type_ = RefIsNull;
    ppuVar8 = &PTR__Expr_001c1a98;
    goto LAB_001691d5;
  case RefNull:
    Consume((Token *)local_358,this);
    ErrorUnlessOpcodeEnabled(this,(Token *)local_358);
    pEVar6 = (Expr *)operator_new(0x40);
    (pEVar6->super_intrusive_list_base<wabt::Expr>).next_ = (Expr *)0x0;
    (pEVar6->super_intrusive_list_base<wabt::Expr>).prev_ = (Expr *)0x0;
    pEVar6->_vptr_Expr = (_func_int **)&PTR__Expr_001c0810;
    (pEVar6->loc).filename.data_ = local_378.filename.data_;
    (pEVar6->loc).filename.size_ = local_378.filename.size_;
    (pEVar6->loc).field_1.field_1.offset = (size_t)local_378.field_1.field_1.offset;
    *(undefined8 *)((long)&(pEVar6->loc).field_1 + 8) = local_378.field_1._8_8_;
    pEVar6->type_ = RefNull;
    ppuVar8 = &PTR__Expr_001c1a60;
    goto LAB_001691d5;
  case Rethrow:
    Consume((Token *)local_358,this);
    ErrorUnlessOpcodeEnabled(this,(Token *)local_358);
    pEVar6 = (Expr *)operator_new(0x40);
    (pEVar6->super_intrusive_list_base<wabt::Expr>).next_ = (Expr *)0x0;
    (pEVar6->super_intrusive_list_base<wabt::Expr>).prev_ = (Expr *)0x0;
    pEVar6->_vptr_Expr = (_func_int **)&PTR__Expr_001c0810;
    (pEVar6->loc).filename.data_ = local_378.filename.data_;
    (pEVar6->loc).filename.size_ = local_378.filename.size_;
    (pEVar6->loc).field_1.field_1.offset = (size_t)local_378.field_1.field_1.offset;
    *(undefined8 *)((long)&(pEVar6->loc).field_1 + 8) = local_378.field_1._8_8_;
    pEVar6->type_ = Rethrow;
    ppuVar8 = &PTR__Expr_001c1b20;
    goto LAB_001691d5;
  case ReturnCallIndirect:
    Consume((Token *)local_358,this);
    ErrorUnlessOpcodeEnabled(this,(Token *)local_358);
    this_01 = (CallIndirectExpr *)operator_new(0x108);
    ReturnCallIndirectExpr::ReturnCallIndirectExpr((ReturnCallIndirectExpr *)this_01,&local_378);
    RVar5 = ParseTypeUseOpt(this,&this_01->decl);
    if ((RVar5.enum_ == Error) ||
       (RVar5 = ParseUnboundFuncSignature(this,&(this_01->decl).sig), RVar5.enum_ == Error))
    goto LAB_00168678;
    Var::Var(&local_c0,0,&local_378);
    ParseVarOpt(this,&this_01->table,&local_c0);
    Var::~Var(&local_c0);
LAB_001688af:
    pEVar7 = (out_expr->_M_t).super___uniq_ptr_impl<wabt::Expr,_std::default_delete<wabt::Expr>_>.
             _M_t.super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
             super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl;
    (out_expr->_M_t).super___uniq_ptr_impl<wabt::Expr,_std::default_delete<wabt::Expr>_>._M_t.
    super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
    super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl = (Expr *)this_01;
    goto LAB_001691de;
  case ReturnCall:
    Consume((Token *)local_358,this);
    ErrorUnlessOpcodeEnabled(this,(Token *)local_358);
    loc_03.filename.size_._0_4_ = (int)local_378.filename.size_;
    loc_03.filename.data_ = local_378.filename.data_;
    loc_03.filename.size_._4_4_ = (int)(local_378.filename.size_ >> 0x20);
    loc_03.field_1.field_0.line = local_378.field_1._0_4_;
    loc_03.field_1.field_0.first_column = local_378.field_1._4_4_;
    loc_03.field_1.field_0.last_column = (int)local_378.field_1._8_8_;
    loc_03.field_1._12_4_ = (int)((ulong)local_378.field_1._8_8_ >> 0x20);
    RVar5 = ParsePlainInstrVar<wabt::VarExpr<(wabt::ExprType)38>>(this,loc_03,out_expr);
    break;
  case Return:
    Consume((Token *)local_358,this);
    pEVar6 = (Expr *)operator_new(0x40);
    (pEVar6->super_intrusive_list_base<wabt::Expr>).next_ = (Expr *)0x0;
    (pEVar6->super_intrusive_list_base<wabt::Expr>).prev_ = (Expr *)0x0;
    pEVar6->_vptr_Expr = (_func_int **)&PTR__Expr_001c0810;
    (pEVar6->loc).filename.data_ = local_378.filename.data_;
    (pEVar6->loc).filename.size_ = local_378.filename.size_;
    (pEVar6->loc).field_1.field_1.offset = (size_t)local_378.field_1.field_1.offset;
    *(undefined8 *)((long)&(pEVar6->loc).field_1 + 8) = local_378.field_1._8_8_;
    pEVar6->type_ = Return;
    ppuVar8 = &PTR__Expr_001c11c8;
    goto LAB_001691d5;
  case Select:
    Consume((Token *)local_358,this);
    local_358._0_8_ = (pointer)0x0;
    local_358._8_4_ = 0;
    local_358._12_4_ = 0;
    local_358._16_4_ = 0;
    local_358._20_4_ = 0;
    if (((this->options_->features).reference_types_enabled_ == true) &&
       (bVar3 = MatchLpar(this,Result), bVar3)) {
      RVar5 = ParseValueTypeList(this,(TypeVector *)local_358);
      if (RVar5.enum_ == Error) {
LAB_001682c2:
        if ((pointer)local_358._0_8_ == (pointer)0x0) {
          return (Result)Error;
        }
        operator_delete((void *)local_358._0_8_);
        return (Result)Error;
      }
      RVar5 = Expect(this,Rpar);
      if (RVar5.enum_ == Error) goto LAB_001682c2;
    }
    else {
      local_310._0_8_ = local_310._0_8_ & 0xffffffff00000000;
      __position._M_current._4_4_ = local_358._12_4_;
      __position._M_current._0_4_ = local_358._8_4_;
      if (__position._M_current == (Type *)CONCAT44(local_358._20_4_,local_358._16_4_)) {
        std::vector<wabt::Type,_std::allocator<wabt::Type>_>::_M_realloc_insert<wabt::Type>
                  ((vector<wabt::Type,_std::allocator<wabt::Type>_> *)local_358,__position,
                   (Type *)local_310);
      }
      else {
        (__position._M_current)->enum_ = Any;
        local_358._8_8_ = __position._M_current + 1;
      }
    }
    pEVar7 = (Expr *)operator_new(0x58);
    std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector
              (&local_250,(vector<wabt::Type,_std::allocator<wabt::Type>_> *)local_358);
    (pEVar7->super_intrusive_list_base<wabt::Expr>).next_ = (Expr *)0x0;
    (pEVar7->super_intrusive_list_base<wabt::Expr>).prev_ = (Expr *)0x0;
    pEVar7->_vptr_Expr = (_func_int **)&PTR__Expr_001c0810;
    (pEVar7->loc).filename.data_ = local_378.filename.data_;
    (pEVar7->loc).filename.size_ = local_378.filename.size_;
    (pEVar7->loc).field_1.field_1.offset = (size_t)local_378.field_1.field_1.offset;
    *(undefined8 *)((long)&(pEVar7->loc).field_1 + 8) = local_378.field_1._8_8_;
    pEVar7->type_ = Select;
    pEVar7->_vptr_Expr = (_func_int **)&PTR__SelectExpr_001c0788;
    std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector
              ((vector<wabt::Type,_std::allocator<wabt::Type>_> *)(pEVar7 + 1),&local_250);
    pEVar6 = (out_expr->_M_t).super___uniq_ptr_impl<wabt::Expr,_std::default_delete<wabt::Expr>_>.
             _M_t.super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
             super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl;
    (out_expr->_M_t).super___uniq_ptr_impl<wabt::Expr,_std::default_delete<wabt::Expr>_>._M_t.
    super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
    super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl = pEVar7;
    if (pEVar6 != (Expr *)0x0) {
      (*pEVar6->_vptr_Expr[1])();
    }
    if (local_250.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_250.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if ((pointer)local_358._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_358._0_8_);
    }
    goto LAB_0016944e;
  case SimdLaneOp:
    Consume((Token *)local_358,this);
    ErrorUnlessOpcodeEnabled(this,(Token *)local_358);
    TVar4 = Peek(this,0);
    if ((TVar4 != Last_Literal) && (TVar4 = Peek(this,0), TVar4 != Int)) {
      pEVar6 = (Expr *)(local_310 + 0x10);
      local_310._0_8_ = pEVar6;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_310,"a natural number","");
      expected = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_2b8;
      local_2b8 = (Expr *)0x0;
      uStack_2b0 = 0;
      uStack_2ac = 0;
      local_2a8 = 0;
      iStack_2a4 = 0;
      pTVar12 = local_2f0;
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      _M_range_initialize<std::__cxx11::string_const*>(expected,(string *)local_310,pTVar12);
      pcVar11 = "123";
LAB_00169735:
      RVar5 = ErrorExpected(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)expected,pcVar11);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)expected);
      if (*(Expr **)(pTVar12 + -8) != pEVar6) {
        operator_delete(*(Expr **)(pTVar12 + -8));
        return (Result)RVar5.enum_;
      }
      return (Result)RVar5.enum_;
    }
    Consume((Token *)local_310,this);
    if (2 < local_2f0[0].enum_ - 0x2f) {
LAB_001697f0:
      __assert_fail("HasLiteral()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/token.h"
                    ,0x6a,"const Literal &wabt::Token::literal() const");
    }
    RVar5 = ParseInt64((char *)local_2e8.name_._M_string_length,
                       (char *)(local_2e8.name_._M_string_length + local_2e8._16_8_),
                       (uint64_t *)local_310,SignedAndUnsigned);
    if (RVar5.enum_ == Error) {
      pcVar11 = "invalid literal \"%.*s\"";
LAB_00169580:
      loc_27.filename.size_._0_4_ = (undefined4)local_378.filename.size_;
      loc_27.filename.data_ = local_378.filename.data_;
      loc_27.filename.size_._4_4_ = local_378.filename.size_._4_4_;
      loc_27.field_1.field_0.line = local_378.field_1.field_0.line;
      loc_27.field_1.field_0.first_column = local_378.field_1.field_0.first_column;
      loc_27.field_1.field_0.last_column = local_378.field_1.field_0.last_column;
      loc_27.field_1._12_4_ = local_378.field_1._12_4_;
      Error(this,loc_27,pcVar11,local_2e8._16_8_ & 0xffffffff,local_2e8.name_._M_string_length,in_R8
            ,in_R9);
      return (Result)Error;
    }
    if ((Expr *)0xff < (ulong)local_310._0_8_) {
      pcVar11 = "lane index \"%.*s\" out-of-range [0, 32)";
      goto LAB_00169580;
    }
    pEVar6 = (Expr *)operator_new(0x48);
    if (0x3d < local_338.enum_ - 0x32) goto LAB_0016980f;
    (pEVar6->super_intrusive_list_base<wabt::Expr>).next_ = (Expr *)0x0;
    (pEVar6->super_intrusive_list_base<wabt::Expr>).prev_ = (Expr *)0x0;
    pEVar6->_vptr_Expr = (_func_int **)&PTR__Expr_001c0810;
    (pEVar6->loc).filename.data_ = local_378.filename.data_;
    (pEVar6->loc).filename.size_ = local_378.filename.size_;
    (pEVar6->loc).field_1.field_1.offset = (size_t)local_378.field_1.field_1.offset;
    *(undefined8 *)((long)&(pEVar6->loc).field_1 + 8) = local_378.field_1._8_8_;
    pEVar6->type_ = SimdLaneOp;
    pEVar6->_vptr_Expr = (_func_int **)&PTR__Expr_001c0920;
    *(Index *)&pEVar6->field_0x3c = aStack_330.index_;
    pEVar6[1]._vptr_Expr = (_func_int **)local_310._0_8_;
    goto LAB_001691d8;
  case SimdShuffleOp:
    Consume((Token *)local_310,this);
    ErrorUnlessOpcodeEnabled(this,(Token *)local_310);
    lVar13 = 0;
    do {
      GetToken((Token *)local_358,this);
      uStack_2b0 = local_358._8_4_;
      uStack_2ac = local_358._12_4_;
      local_2a8 = local_358._16_4_;
      iStack_2a4 = local_358._20_4_;
      iStack_2a0 = local_358._24_4_;
      uStack_29c = local_358._28_4_;
      local_2b8 = (Expr *)local_358._0_8_;
      TVar4 = Peek(this,0);
      if (TVar4 != Last_Literal) {
        pEVar6 = (Expr *)(local_358 + 0x10);
        local_358._0_8_ = pEVar6;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_358,"a natural number in range [0, 32)","");
        expected = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_238;
        local_238 = 0;
        uStack_230 = 0;
        local_228 = 0;
        pTVar12 = &local_338;
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        _M_range_initialize<std::__cxx11::string_const*>(expected,(string *)local_358,pTVar12);
        pcVar11 = (char *)0x0;
        goto LAB_00169735;
      }
      Consume((Token *)local_358,this);
      uVar2 = aStack_330._16_4_;
      uVar1 = aStack_330.name_._M_string_length;
      if (2 < local_338.enum_ - 0x2f) goto LAB_001697f0;
      local_358._0_8_ = local_358._0_8_ & 0xffffffff00000000;
      RVar5 = ParseInt32((char *)aStack_330.name_._M_string_length,
                         (char *)(aStack_330.name_._M_string_length +
                                 CONCAT44(aStack_330._20_4_,aStack_330._16_4_)),
                         (uint32_t *)local_358,UnsignedOnly);
      if (RVar5.enum_ == Error) {
        pcVar11 = "invalid literal \"%.*s\"";
LAB_00169763:
        loc_28.filename.size_._0_4_ = uStack_2b0;
        loc_28.filename.data_ = (char *)local_2b8;
        loc_28.filename.size_._4_4_ = uStack_2ac;
        loc_28.field_1.field_0.line = local_2a8;
        loc_28.field_1.field_0.first_column = iStack_2a4;
        loc_28.field_1.field_0.last_column = iStack_2a0;
        loc_28.field_1._12_4_ = uStack_29c;
        Error(this,loc_28,pcVar11,uVar2,uVar1,in_R8,in_R9);
        return (Result)Error;
      }
      if (0xff < (uint)local_358._0_4_) {
        pcVar11 = "shuffle index \"%.*s\" out-of-range [0, 32)";
        goto LAB_00169763;
      }
      *(char *)((long)&local_2c8 + lVar13) = (char)local_358._0_8_;
      lVar13 = lVar13 + 1;
    } while (lVar13 != 0x10);
    pEVar6 = (Expr *)operator_new(0x50);
    if (0x3d < local_2f0[0].enum_ - 0x32) goto LAB_0016980f;
    (pEVar6->super_intrusive_list_base<wabt::Expr>).next_ = (Expr *)0x0;
    (pEVar6->super_intrusive_list_base<wabt::Expr>).prev_ = (Expr *)0x0;
    pEVar6->_vptr_Expr = (_func_int **)&PTR__Expr_001c0810;
    (pEVar6->loc).filename.data_ = local_378.filename.data_;
    (pEVar6->loc).filename.size_ = local_378.filename.size_;
    (pEVar6->loc).field_1.field_1.offset = (size_t)local_378.field_1.field_1.offset;
    *(undefined8 *)((long)&(pEVar6->loc).field_1 + 8) = local_378.field_1._8_8_;
    pEVar6->type_ = SimdShuffleOp;
    pEVar6->_vptr_Expr = (_func_int **)&PTR__Expr_001c0970;
    *(Index *)&pEVar6->field_0x3c = local_2e8.index_;
    pEVar6[1]._vptr_Expr = local_2c8;
    pEVar6[1].super_intrusive_list_base<wabt::Expr>.next_ = local_2c0;
    goto LAB_001691d8;
  case Store:
    local_288.offset = (size_t)local_378.field_1.field_1.offset;
    uStack_280 = local_378.field_1._8_8_;
    local_298 = (Expr *)local_378.filename.data_;
    sStack_290 = local_378.filename.size_;
    Consume(&local_218,this);
    loc_25.filename.size_._0_4_ = (int)sStack_290;
    loc_25.filename.data_ = (char *)local_298;
    loc_25.filename.size_._4_4_ = (int)(sStack_290 >> 0x20);
    loc_25.field_1.field_0.line = (int)local_288.offset;
    loc_25.field_1.field_0.first_column = (int)(local_288.offset >> 0x20);
    loc_25.field_1.field_0.last_column = (int)uStack_280;
    loc_25.field_1._12_4_ = (int)((ulong)uStack_280 >> 0x20);
    token_07.loc.filename.size_ = local_218.loc.filename.size_;
    token_07.loc.filename.data_ = local_218.loc.filename.data_;
    token_07.loc.field_1.field_1.offset = local_218.loc.field_1.field_1.offset;
    token_07.loc.field_1._8_8_ = local_218.loc.field_1._8_8_;
    token_07.token_type_ = local_218.token_type_;
    token_07._36_4_ = local_218._36_4_;
    token_07.field_2.text_.data_ = local_218.field_2.text_.data_;
    token_07.field_2.text_.size_ = local_218.field_2.text_.size_;
    token_07.field_2.literal_.text.size_ = local_218.field_2.literal_.text.size_;
    RVar5 = ParsePlainLoadStoreInstr<wabt::LoadStoreExpr<(wabt::ExprType)44>>
                      (this,loc_25,token_07,out_expr);
    break;
  case TableCopy:
    Consume((Token *)local_358,this);
    ErrorUnlessOpcodeEnabled(this,(Token *)local_358);
    Var::Var((Var *)local_358,0,&local_378);
    Var::Var((Var *)local_310,0,&local_378);
    if ((this->options_->features).reference_types_enabled_ == true) {
      Var::Var(&local_108,(Var *)local_358);
      ParseVarOpt(this,(Var *)local_358,&local_108);
      Var::~Var(&local_108);
      Var::Var(&local_150,(Var *)local_310);
      ParseVarOpt(this,(Var *)local_310,&local_150);
      Var::~Var(&local_150);
    }
    this_00 = (TableCopyExpr *)operator_new(0xd0);
    TableCopyExpr::TableCopyExpr(this_00,(Var *)local_358,(Var *)local_310,&local_378);
    pEVar6 = (out_expr->_M_t).super___uniq_ptr_impl<wabt::Expr,_std::default_delete<wabt::Expr>_>.
             _M_t.super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
             super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl;
    (out_expr->_M_t).super___uniq_ptr_impl<wabt::Expr,_std::default_delete<wabt::Expr>_>._M_t.
    super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
    super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl = (Expr *)this_00;
    if (pEVar6 != (Expr *)0x0) {
      (*pEVar6->_vptr_Expr[1])();
    }
    Var::~Var((Var *)local_310);
    Var::~Var((Var *)local_358);
    goto LAB_0016944e;
  case TableFill:
    Consume((Token *)local_358,this);
    ErrorUnlessOpcodeEnabled(this,(Token *)local_358);
    loc_13.filename.size_._0_4_ = (int)local_378.filename.size_;
    loc_13.filename.data_ = local_378.filename.data_;
    loc_13.filename.size_._4_4_ = (int)(local_378.filename.size_ >> 0x20);
    loc_13.field_1.field_0.line = local_378.field_1._0_4_;
    loc_13.field_1.field_0.first_column = local_378.field_1._4_4_;
    loc_13.field_1.field_0.last_column = (int)local_378.field_1._8_8_;
    loc_13.field_1._12_4_ = (int)((ulong)local_378.field_1._8_8_ >> 0x20);
    RVar5 = ParsePlainInstrVar<wabt::VarExpr<(wabt::ExprType)52>>(this,loc_13,out_expr);
    break;
  case TableGet:
    Consume((Token *)local_358,this);
    ErrorUnlessOpcodeEnabled(this,(Token *)local_358);
    loc_24.filename.size_._0_4_ = (int)local_378.filename.size_;
    loc_24.filename.data_ = local_378.filename.data_;
    loc_24.filename.size_._4_4_ = (int)(local_378.filename.size_ >> 0x20);
    loc_24.field_1.field_0.line = local_378.field_1._0_4_;
    loc_24.field_1.field_0.first_column = local_378.field_1._4_4_;
    loc_24.field_1.field_0.last_column = (int)local_378.field_1._8_8_;
    loc_24.field_1._12_4_ = (int)((ulong)local_378.field_1._8_8_ >> 0x20);
    RVar5 = ParsePlainInstrVar<wabt::VarExpr<(wabt::ExprType)48>>(this,loc_24,out_expr);
    break;
  case TableGrow:
    Consume((Token *)local_358,this);
    ErrorUnlessOpcodeEnabled(this,(Token *)local_358);
    loc_01.filename.size_._0_4_ = (int)local_378.filename.size_;
    loc_01.filename.data_ = local_378.filename.data_;
    loc_01.filename.size_._4_4_ = (int)(local_378.filename.size_ >> 0x20);
    loc_01.field_1.field_0.line = local_378.field_1._0_4_;
    loc_01.field_1.field_0.first_column = local_378.field_1._4_4_;
    loc_01.field_1.field_0.last_column = (int)local_378.field_1._8_8_;
    loc_01.field_1._12_4_ = (int)((ulong)local_378.field_1._8_8_ >> 0x20);
    RVar5 = ParsePlainInstrVar<wabt::VarExpr<(wabt::ExprType)49>>(this,loc_01,out_expr);
    break;
  case TableInit:
    Consume((Token *)local_358,this);
    ErrorUnlessOpcodeEnabled(this,(Token *)local_358);
    Var::Var((Var *)local_358,0,&local_378);
    RVar5 = ParseVar(this,(Var *)local_358);
    if (RVar5.enum_ == Error) {
      Var::~Var((Var *)local_358);
      return (Result)Error;
    }
    Var::Var((Var *)local_310,0,&local_378);
    Var::Var(&local_198,(Var *)local_310);
    bVar3 = ParseVarOpt(this,(Var *)local_310,&local_198);
    Var::~Var(&local_198);
    if (bVar3) {
      std::swap<wabt::Var>((Var *)local_358,(Var *)local_310);
    }
    this_02 = (TableInitExpr *)operator_new(0xd0);
    TableInitExpr::TableInitExpr(this_02,(Var *)local_358,(Var *)local_310,&local_378);
    pEVar6 = (out_expr->_M_t).super___uniq_ptr_impl<wabt::Expr,_std::default_delete<wabt::Expr>_>.
             _M_t.super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
             super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl;
    (out_expr->_M_t).super___uniq_ptr_impl<wabt::Expr,_std::default_delete<wabt::Expr>_>._M_t.
    super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
    super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl = (Expr *)this_02;
    if (pEVar6 != (Expr *)0x0) {
      (*pEVar6->_vptr_Expr[1])();
    }
    Var::~Var((Var *)local_310);
    Var::~Var((Var *)local_358);
    goto joined_r0x00169559;
  case TableSet:
    Consume((Token *)local_358,this);
    ErrorUnlessOpcodeEnabled(this,(Token *)local_358);
    loc_23.filename.size_._0_4_ = (int)local_378.filename.size_;
    loc_23.filename.data_ = local_378.filename.data_;
    loc_23.filename.size_._4_4_ = (int)(local_378.filename.size_ >> 0x20);
    loc_23.field_1.field_0.line = local_378.field_1._0_4_;
    loc_23.field_1.field_0.first_column = local_378.field_1._4_4_;
    loc_23.field_1.field_0.last_column = (int)local_378.field_1._8_8_;
    loc_23.field_1._12_4_ = (int)((ulong)local_378.field_1._8_8_ >> 0x20);
    RVar5 = ParsePlainInstrVar<wabt::VarExpr<(wabt::ExprType)51>>(this,loc_23,out_expr);
    break;
  case TableSize:
    Consume((Token *)local_358,this);
    ErrorUnlessOpcodeEnabled(this,(Token *)local_358);
    loc_26.filename.size_._0_4_ = (int)local_378.filename.size_;
    loc_26.filename.data_ = local_378.filename.data_;
    loc_26.filename.size_._4_4_ = (int)(local_378.filename.size_ >> 0x20);
    loc_26.field_1.field_0.line = local_378.field_1._0_4_;
    loc_26.field_1.field_0.first_column = local_378.field_1._4_4_;
    loc_26.field_1.field_0.last_column = (int)local_378.field_1._8_8_;
    loc_26.field_1._12_4_ = (int)((ulong)local_378.field_1._8_8_ >> 0x20);
    RVar5 = ParsePlainInstrVar<wabt::VarExpr<(wabt::ExprType)50>>(this,loc_26,out_expr);
    break;
  case Ternary:
    Consume((Token *)local_358,this);
    ErrorUnlessOpcodeEnabled(this,(Token *)local_358);
    pEVar6 = (Expr *)operator_new(0x40);
    if (0x3d < local_338.enum_ - 0x32) goto LAB_0016980f;
    (pEVar6->super_intrusive_list_base<wabt::Expr>).next_ = (Expr *)0x0;
    (pEVar6->super_intrusive_list_base<wabt::Expr>).prev_ = (Expr *)0x0;
    pEVar6->_vptr_Expr = (_func_int **)&PTR__Expr_001c0810;
    (pEVar6->loc).filename.data_ = local_378.filename.data_;
    (pEVar6->loc).filename.size_ = local_378.filename.size_;
    (pEVar6->loc).field_1.field_1.offset = (size_t)local_378.field_1.field_1.offset;
    *(undefined8 *)((long)&(pEVar6->loc).field_1 + 8) = local_378.field_1._8_8_;
    pEVar6->type_ = Ternary;
    ppuVar8 = &PTR__Expr_001c1d38;
    goto LAB_00168f4a;
  case Throw:
    Consume((Token *)local_358,this);
    ErrorUnlessOpcodeEnabled(this,(Token *)local_358);
    loc_19.filename.size_._0_4_ = (int)local_378.filename.size_;
    loc_19.filename.data_ = local_378.filename.data_;
    loc_19.filename.size_._4_4_ = (int)(local_378.filename.size_ >> 0x20);
    loc_19.field_1.field_0.line = local_378.field_1._0_4_;
    loc_19.field_1.field_0.first_column = local_378.field_1._4_4_;
    loc_19.field_1.field_0.last_column = (int)local_378.field_1._8_8_;
    loc_19.field_1._12_4_ = (int)((ulong)local_378.field_1._8_8_ >> 0x20);
    RVar5 = ParsePlainInstrVar<wabt::VarExpr<(wabt::ExprType)54>>(this,loc_19,out_expr);
    break;
  case Unary:
    Consume((Token *)local_358,this);
    ErrorUnlessOpcodeEnabled(this,(Token *)local_358);
    pEVar6 = (Expr *)operator_new(0x40);
    if (0x3d < local_338.enum_ - 0x32) goto LAB_0016980f;
    (pEVar6->super_intrusive_list_base<wabt::Expr>).next_ = (Expr *)0x0;
    (pEVar6->super_intrusive_list_base<wabt::Expr>).prev_ = (Expr *)0x0;
    pEVar6->_vptr_Expr = (_func_int **)&PTR__Expr_001c0810;
    (pEVar6->loc).filename.data_ = local_378.filename.data_;
    (pEVar6->loc).filename.size_ = local_378.filename.size_;
    (pEVar6->loc).field_1.field_1.offset = (size_t)local_378.field_1.field_1.offset;
    *(undefined8 *)((long)&(pEVar6->loc).field_1 + 8) = local_378.field_1._8_8_;
    pEVar6->type_ = Unary;
    ppuVar8 = &PTR__Expr_001c1570;
LAB_00168f4a:
    pEVar6->_vptr_Expr = (_func_int **)ppuVar8;
    *(undefined4 *)&pEVar6->field_0x3c = aStack_330.index_;
    goto LAB_001691d8;
  case Last_Opcode:
    Consume((Token *)local_358,this);
    pEVar6 = (Expr *)operator_new(0x40);
    (pEVar6->super_intrusive_list_base<wabt::Expr>).next_ = (Expr *)0x0;
    (pEVar6->super_intrusive_list_base<wabt::Expr>).prev_ = (Expr *)0x0;
    pEVar6->_vptr_Expr = (_func_int **)&PTR__Expr_001c0810;
    (pEVar6->loc).filename.data_ = local_378.filename.data_;
    (pEVar6->loc).filename.size_ = local_378.filename.size_;
    (pEVar6->loc).field_1.field_1.offset = (size_t)local_378.field_1.field_1.offset;
    *(undefined8 *)((long)&(pEVar6->loc).field_1 + 8) = local_378.field_1._8_8_;
    pEVar6->type_ = Last;
    ppuVar8 = &PTR__Expr_001c0fe0;
LAB_001691d5:
    pEVar6->_vptr_Expr = (_func_int **)ppuVar8;
LAB_001691d8:
    pEVar7 = (out_expr->_M_t).super___uniq_ptr_impl<wabt::Expr,_std::default_delete<wabt::Expr>_>.
             _M_t.super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
             super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl;
    (out_expr->_M_t).super___uniq_ptr_impl<wabt::Expr,_std::default_delete<wabt::Expr>_>._M_t.
    super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
    super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl = pEVar6;
LAB_001691de:
    if (pEVar7 != (Expr *)0x0) {
      (*pEVar7->_vptr_Expr[1])();
    }
    goto LAB_0016944e;
  }
  EVar9 = Error;
  if (RVar5.enum_ != Error) {
LAB_0016944e:
    EVar9 = Ok;
  }
  return (Result)EVar9;
}

Assistant:

Result WastParser::ParsePlainInstr(std::unique_ptr<Expr>* out_expr) {
  WABT_TRACE(ParsePlainInstr);
  Location loc = GetLocation();
  switch (Peek()) {
    case TokenType::Unreachable:
      Consume();
      out_expr->reset(new UnreachableExpr(loc));
      break;

    case TokenType::Nop:
      Consume();
      out_expr->reset(new NopExpr(loc));
      break;

    case TokenType::Drop:
      Consume();
      out_expr->reset(new DropExpr(loc));
      break;

    case TokenType::Select: {
      Consume();
      TypeVector result;
      if (options_->features.reference_types_enabled() &&
          MatchLpar(TokenType::Result)) {
        CHECK_RESULT(ParseValueTypeList(&result));
        EXPECT(Rpar);
      } else {
        result.push_back(Type::Any);
      }
      out_expr->reset(new SelectExpr(result, loc));
      break;
    }

    case TokenType::Br:
      Consume();
      CHECK_RESULT(ParsePlainInstrVar<BrExpr>(loc, out_expr));
      break;

    case TokenType::BrIf:
      Consume();
      CHECK_RESULT(ParsePlainInstrVar<BrIfExpr>(loc, out_expr));
      break;

    case TokenType::BrOnExn: {
      Consume();
      auto expr = MakeUnique<BrOnExnExpr>(loc);
      CHECK_RESULT(ParseVar(&expr->label_var));
      CHECK_RESULT(ParseVar(&expr->event_var));
      *out_expr = std::move(expr);
      break;
    }

    case TokenType::BrTable: {
      Consume();
      auto expr = MakeUnique<BrTableExpr>(loc);
      CHECK_RESULT(ParseVarList(&expr->targets));
      expr->default_target = expr->targets.back();
      expr->targets.pop_back();
      *out_expr = std::move(expr);
      break;
    }

    case TokenType::Return:
      Consume();
      out_expr->reset(new ReturnExpr(loc));
      break;

    case TokenType::Call:
      Consume();
      CHECK_RESULT(ParsePlainInstrVar<CallExpr>(loc, out_expr));
      break;

    case TokenType::CallIndirect: {
      Consume();
      auto expr = MakeUnique<CallIndirectExpr>(loc);
      ParseVarOpt(&expr->table, Var(0, loc));
      CHECK_RESULT(ParseTypeUseOpt(&expr->decl));
      CHECK_RESULT(ParseUnboundFuncSignature(&expr->decl.sig));
      *out_expr = std::move(expr);
      break;
    }

    case TokenType::ReturnCall:
      ErrorUnlessOpcodeEnabled(Consume());
      CHECK_RESULT(ParsePlainInstrVar<ReturnCallExpr>(loc, out_expr));
      break;

    case TokenType::ReturnCallIndirect: {
      ErrorUnlessOpcodeEnabled(Consume());
      auto expr = MakeUnique<ReturnCallIndirectExpr>(loc);
      CHECK_RESULT(ParseTypeUseOpt(&expr->decl));
      CHECK_RESULT(ParseUnboundFuncSignature(&expr->decl.sig));
      ParseVarOpt(&expr->table, Var(0, loc));
      *out_expr = std::move(expr);
      break;
    }

    case TokenType::LocalGet:
      Consume();
      CHECK_RESULT(ParsePlainInstrVar<LocalGetExpr>(loc, out_expr));
      break;

    case TokenType::LocalSet:
      Consume();
      CHECK_RESULT(ParsePlainInstrVar<LocalSetExpr>(loc, out_expr));
      break;

    case TokenType::LocalTee:
      Consume();
      CHECK_RESULT(ParsePlainInstrVar<LocalTeeExpr>(loc, out_expr));
      break;

    case TokenType::GlobalGet:
      Consume();
      CHECK_RESULT(ParsePlainInstrVar<GlobalGetExpr>(loc, out_expr));
      break;

    case TokenType::GlobalSet:
      Consume();
      CHECK_RESULT(ParsePlainInstrVar<GlobalSetExpr>(loc, out_expr));
      break;

    case TokenType::Load:
      CHECK_RESULT(
          ParsePlainLoadStoreInstr<LoadExpr>(loc, Consume(), out_expr));
      break;

    case TokenType::Store:
      CHECK_RESULT(
          ParsePlainLoadStoreInstr<StoreExpr>(loc, Consume(), out_expr));
      break;

    case TokenType::Const: {
      Const const_;
      CHECK_RESULT(ParseConst(&const_, ConstType::Normal));
      out_expr->reset(new ConstExpr(const_, loc));
      break;
    }

    case TokenType::Unary: {
      Token token = Consume();
      ErrorUnlessOpcodeEnabled(token);
      out_expr->reset(new UnaryExpr(token.opcode(), loc));
      break;
    }

    case TokenType::Binary: {
      Token token = Consume();
      ErrorUnlessOpcodeEnabled(token);
      out_expr->reset(new BinaryExpr(token.opcode(), loc));
      break;
    }

    case TokenType::Compare:
      out_expr->reset(new CompareExpr(Consume().opcode(), loc));
      break;

    case TokenType::Convert: {
      Token token = Consume();
      ErrorUnlessOpcodeEnabled(token);
      out_expr->reset(new ConvertExpr(token.opcode(), loc));
      break;
    }

    case TokenType::MemoryCopy:
      ErrorUnlessOpcodeEnabled(Consume());
      out_expr->reset(new MemoryCopyExpr(loc));
      break;

    case TokenType::MemoryFill:
      ErrorUnlessOpcodeEnabled(Consume());
      out_expr->reset(new MemoryFillExpr(loc));
      break;

    case TokenType::DataDrop:
      ErrorUnlessOpcodeEnabled(Consume());
      CHECK_RESULT(ParsePlainInstrVar<DataDropExpr>(loc, out_expr));
      break;

    case TokenType::MemoryInit:
      ErrorUnlessOpcodeEnabled(Consume());
      CHECK_RESULT(ParsePlainInstrVar<MemoryInitExpr>(loc, out_expr));
      break;

    case TokenType::MemorySize:
      Consume();
      out_expr->reset(new MemorySizeExpr(loc));
      break;

    case TokenType::MemoryGrow:
      Consume();
      out_expr->reset(new MemoryGrowExpr(loc));
      break;

    case TokenType::TableCopy: {
      ErrorUnlessOpcodeEnabled(Consume());
      Var dst(0, loc);
      Var src(0, loc);
      if (options_->features.reference_types_enabled()) {
        ParseVarOpt(&dst, dst);
        ParseVarOpt(&src, src);
      }
      out_expr->reset(new TableCopyExpr(dst, src, loc));
      break;
    }

    case TokenType::ElemDrop:
      ErrorUnlessOpcodeEnabled(Consume());
      CHECK_RESULT(ParsePlainInstrVar<ElemDropExpr>(loc, out_expr));
      break;

    case TokenType::TableInit: {
      ErrorUnlessOpcodeEnabled(Consume());
      Var segment_index(0, loc);
      CHECK_RESULT(ParseVar(&segment_index));
      Var table_index(0, loc);
      if (ParseVarOpt(&table_index, table_index)) {
        // Here are the two forms:
        //
        //   table.init $elemidx ...
        //   table.init $tableidx $elemidx ...
        //
        // So if both indexes are provided, we need to swap them.
        std::swap(segment_index, table_index);
      }
      out_expr->reset(new TableInitExpr(segment_index, table_index, loc));
      break;
    }

    case TokenType::TableGet:
      ErrorUnlessOpcodeEnabled(Consume());
      CHECK_RESULT(ParsePlainInstrVar<TableGetExpr>(loc, out_expr));
      break;

    case TokenType::TableSet:
      ErrorUnlessOpcodeEnabled(Consume());
      // TODO: Table index.
      CHECK_RESULT(ParsePlainInstrVar<TableSetExpr>(loc, out_expr));
      break;

    case TokenType::TableGrow:
      ErrorUnlessOpcodeEnabled(Consume());
      // TODO: Table index.
      CHECK_RESULT(ParsePlainInstrVar<TableGrowExpr>(loc, out_expr));
      break;

    case TokenType::TableSize:
      ErrorUnlessOpcodeEnabled(Consume());
      // TODO: Table index.
      CHECK_RESULT(ParsePlainInstrVar<TableSizeExpr>(loc, out_expr));
      break;

    case TokenType::TableFill:
      ErrorUnlessOpcodeEnabled(Consume());
      // TODO: Table index.
      CHECK_RESULT(ParsePlainInstrVar<TableFillExpr>(loc, out_expr));
      break;

    case TokenType::RefFunc:
      ErrorUnlessOpcodeEnabled(Consume());
      CHECK_RESULT(ParsePlainInstrVar<RefFuncExpr>(loc, out_expr));
      break;

    case TokenType::RefNull:
      ErrorUnlessOpcodeEnabled(Consume());
      out_expr->reset(new RefNullExpr(loc));
      break;

    case TokenType::RefIsNull:
      ErrorUnlessOpcodeEnabled(Consume());
      out_expr->reset(new RefIsNullExpr(loc));
      break;

    case TokenType::Throw:
      ErrorUnlessOpcodeEnabled(Consume());
      CHECK_RESULT(ParsePlainInstrVar<ThrowExpr>(loc, out_expr));
      break;

    case TokenType::Rethrow:
      ErrorUnlessOpcodeEnabled(Consume());
      out_expr->reset(new RethrowExpr(loc));
      break;

    case TokenType::AtomicNotify: {
      Token token = Consume();
      ErrorUnlessOpcodeEnabled(token);
      CHECK_RESULT(
          ParsePlainLoadStoreInstr<AtomicNotifyExpr>(loc, token, out_expr));
      break;
    }

    case TokenType::AtomicWait: {
      Token token = Consume();
      ErrorUnlessOpcodeEnabled(token);
      CHECK_RESULT(
          ParsePlainLoadStoreInstr<AtomicWaitExpr>(loc, token, out_expr));
      break;
    }

    case TokenType::AtomicLoad: {
      Token token = Consume();
      ErrorUnlessOpcodeEnabled(token);
      CHECK_RESULT(
          ParsePlainLoadStoreInstr<AtomicLoadExpr>(loc, token, out_expr));
      break;
    }

    case TokenType::AtomicStore: {
      Token token = Consume();
      ErrorUnlessOpcodeEnabled(token);
      CHECK_RESULT(
          ParsePlainLoadStoreInstr<AtomicStoreExpr>(loc, token, out_expr));
      break;
    }

    case TokenType::AtomicRmw: {
      Token token = Consume();
      ErrorUnlessOpcodeEnabled(token);
      CHECK_RESULT(
          ParsePlainLoadStoreInstr<AtomicRmwExpr>(loc, token, out_expr));
      break;
    }

    case TokenType::AtomicRmwCmpxchg: {
      Token token = Consume();
      ErrorUnlessOpcodeEnabled(token);
      CHECK_RESULT(
          ParsePlainLoadStoreInstr<AtomicRmwCmpxchgExpr>(loc, token, out_expr));
      break;
    }

    case TokenType::Ternary: {
      Token token = Consume();
      ErrorUnlessOpcodeEnabled(token);
      out_expr->reset(new TernaryExpr(token.opcode(), loc));
      break;
    }

    case TokenType::SimdLaneOp: {
      Token token = Consume();
      ErrorUnlessOpcodeEnabled(token);
      if (!PeekMatch(TokenType::Nat) && !PeekMatch(TokenType::Int)) {
        return ErrorExpected({"a natural number"}, "123");
      }

      Literal literal = Consume().literal();
      uint64_t lane_idx;

      // TODO: The simd tests currently allow a lane number with an optional +,
      // but probably shouldn't. See
      // https://github.com/WebAssembly/simd/issues/181#issuecomment-597386919
      Result result = ParseInt64(literal.text.begin(), literal.text.end(),
                                 &lane_idx, ParseIntType::SignedAndUnsigned);

      if (Failed(result)) {
        Error(loc, "invalid literal \"" PRIstringview "\"",
              WABT_PRINTF_STRING_VIEW_ARG(literal.text));
        return Result::Error;
      }

      // TODO: Should share lane validation logic w/ SimdShuffleOp below. (See
      // comment below for explanation of 255 vs. 32)
      if (lane_idx > 255) {
        Error(loc, "lane index \"" PRIstringview "\" out-of-range [0, 32)",
              WABT_PRINTF_STRING_VIEW_ARG(literal.text));
        return Result::Error;
      }
      out_expr->reset(new SimdLaneOpExpr(token.opcode(), lane_idx, loc));
      break;
    }

    case TokenType::SimdShuffleOp: {
      Token token = Consume();
      ErrorUnlessOpcodeEnabled(token);
      uint8_t values[16];
      for (int lane = 0; lane < 16; ++lane) {
        Location loc = GetLocation();

        if (!PeekMatch(TokenType::Nat)) {
          return ErrorExpected({"a natural number in range [0, 32)"});
        }

        Literal literal = Consume().literal();

        string_view sv = literal.text;
        const char* s = sv.begin();
        const char* end = sv.end();
        Result result;

        uint32_t value = 0;
        result = ParseInt32(s, end, &value, ParseIntType::UnsignedOnly);

        if (Failed(result)) {
          Error(loc, "invalid literal \"" PRIstringview "\"",
                WABT_PRINTF_STRING_VIEW_ARG(literal.text));
          return Result::Error;
        }

        // The valid range is only [0, 32), but it's only malformed if it can't
        // fit in a byte.
        if (value > 255) {
          Error(loc,
                "shuffle index \"" PRIstringview "\" out-of-range [0, 32)",
                WABT_PRINTF_STRING_VIEW_ARG(literal.text));
          return Result::Error;
        }

        values[lane] = static_cast<uint8_t>(value);
      }
      v128 value = Bitcast<v128>(values);

      out_expr->reset(
          new SimdShuffleOpExpr(token.opcode(), value, loc));
      break;
    }

    default:
      assert(
          !"ParsePlainInstr should only be called when IsPlainInstr() is true");
      return Result::Error;
  }

  return Result::Ok;
}